

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

size_t quicly_decode_packet
                 (quicly_context_t *ctx,quicly_decoded_packet_t *packet,uint8_t *datagram,
                 size_t datagram_size,size_t *off)

{
  undefined1 *puVar1;
  uint8_t *end;
  byte bVar2;
  uint uVar3;
  st_quicly_cid_encryptor_t *psVar4;
  anon_enum_32 aVar5;
  byte *pbVar6;
  size_t sVar7;
  uint64_t uVar8;
  ulong uVar9;
  byte *pbVar10;
  long lVar11;
  uint8_t *puVar12;
  ulong uVar13;
  byte *local_30;
  
  uVar9 = *off;
  if (datagram_size < uVar9) {
    __assert_fail("*off <= datagram_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x261,
                  "size_t quicly_decode_packet(quicly_context_t *, quicly_decoded_packet_t *, const uint8_t *, size_t, size_t *)"
                 );
  }
  pbVar6 = datagram + uVar9;
  (packet->octets).base = pbVar6;
  (packet->octets).len = datagram_size - uVar9;
  if (datagram_size - uVar9 < 2) {
    return 0xffffffffffffffff;
  }
  end = datagram + datagram_size;
  sVar7 = 0;
  if (*off == 0) {
    sVar7 = datagram_size;
  }
  packet->datagram_size = sVar7;
  (packet->token).base = (uint8_t *)0x0;
  (packet->token).len = 0;
  (packet->decrypted).pn = 0xffffffffffffffff;
  sVar7 = *off;
  puVar12 = datagram + sVar7 + 1;
  if ((char)*pbVar6 < '\0') {
    if ((long)end - (long)puVar12 < 5) {
      return 0xffffffffffffffff;
    }
    uVar3 = *(uint *)(datagram + sVar7 + 1);
    packet->version =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    uVar9 = (ulong)datagram[sVar7 + 5];
    puVar12 = datagram + sVar7 + 6;
    (packet->cid).dest.encrypted.len = uVar9;
    if ((ulong)((long)end - (long)puVar12) <= uVar9) {
      return 0xffffffffffffffff;
    }
    (packet->cid).dest.encrypted.base = puVar12;
    pbVar10 = puVar12 + uVar9 + 1;
    uVar13 = (ulong)puVar12[uVar9];
    (packet->cid).src.len = uVar13;
    if ((ulong)((long)end - (long)pbVar10) < uVar13) {
      return 0xffffffffffffffff;
    }
    (packet->cid).src.base = pbVar10;
    pbVar10 = pbVar10 + uVar13;
    local_30 = pbVar10;
    if ((*pbVar6 & 0xf0 | 0x10) == 0xd0) {
      psVar4 = ctx->cid_encryptor;
      if ((uVar9 == 0 || psVar4 == (st_quicly_cid_encryptor_t *)0x0) ||
         (sVar7 = (*psVar4->decrypt_cid)(psVar4,&(packet->cid).dest.plaintext,puVar12,uVar9),
         sVar7 == 0xffffffffffffffff)) {
        (packet->cid).dest.plaintext = quicly_cid_plaintext_invalid;
      }
      puVar1 = &(packet->cid).dest.field_0x20;
      *puVar1 = *puVar1 | 1;
    }
    else {
      psVar4 = ctx->cid_encryptor;
      if (psVar4 == (st_quicly_cid_encryptor_t *)0x0) {
        (packet->cid).dest.plaintext = quicly_cid_plaintext_invalid;
      }
      else {
        if (uVar9 == 0) {
          return 0xffffffffffffffff;
        }
        sVar7 = (*psVar4->decrypt_cid)(psVar4,&(packet->cid).dest.plaintext,puVar12,uVar9);
        if (sVar7 == 0xffffffffffffffff) {
          return 0xffffffffffffffff;
        }
      }
      puVar1 = &(packet->cid).dest.field_0x20;
      *puVar1 = *puVar1 & 0xfe;
    }
    if ((packet->version == 0xff00001d) || (packet->version == 0xff00001b)) {
      pbVar6 = (packet->octets).base;
      bVar2 = *pbVar6;
      if (bVar2 < 0xf0) {
        if ((bVar2 & 0xf0) == 0xc0) {
          uVar8 = ptls_decode_quicint(&local_30,end);
          if (uVar8 == 0xffffffffffffffff) {
            return 0xffffffffffffffff;
          }
          if ((ulong)((long)end - (long)local_30) < uVar8) {
            return 0xffffffffffffffff;
          }
          (packet->token).base = local_30;
          (packet->token).len = uVar8;
          local_30 = local_30 + uVar8;
        }
        uVar8 = ptls_decode_quicint(&local_30,end);
        if (uVar8 + 1 < 2) {
          return 0xffffffffffffffff;
        }
        if ((ulong)((long)end - (long)local_30) < uVar8) {
          return 0xffffffffffffffff;
        }
        sVar7 = (long)local_30 - (long)(packet->octets).base;
        packet->encrypted_off = sVar7;
        (packet->octets).len = sVar7 + uVar8;
      }
      else {
        lVar11 = (long)end - (long)pbVar10;
        if (lVar11 < 0x11) {
          return 0xffffffffffffffff;
        }
        (packet->token).base = pbVar10;
        (packet->token).len = lVar11 - 0x10;
        packet->encrypted_off = (size_t)(pbVar10 + ((lVar11 + -0x10) - (long)pbVar6));
      }
    }
    else {
      packet->encrypted_off = (long)pbVar10 - (long)(packet->octets).base;
    }
    aVar5 = QUICLY__DECODED_PACKET_CACHED_NOT_STATELESS_RESET;
  }
  else {
    psVar4 = ctx->cid_encryptor;
    if (psVar4 == (st_quicly_cid_encryptor_t *)0x0) {
      (packet->cid).dest.encrypted.base = (uint8_t *)0x0;
      (packet->cid).dest.encrypted.len = 0;
      (packet->cid).dest.plaintext = quicly_cid_plaintext_invalid;
    }
    else {
      if ((long)end - (long)puVar12 < 0x14) {
        return 0xffffffffffffffff;
      }
      sVar7 = (*psVar4->decrypt_cid)(psVar4,&(packet->cid).dest.plaintext,puVar12,0);
      if (sVar7 == 0xffffffffffffffff) {
        return 0xffffffffffffffff;
      }
      (packet->cid).dest.encrypted.base = puVar12;
      (packet->cid).dest.encrypted.len = sVar7;
      puVar12 = puVar12 + sVar7;
      pbVar6 = (packet->octets).base;
    }
    puVar1 = &(packet->cid).dest.field_0x20;
    *puVar1 = *puVar1 & 0xfe;
    (packet->cid).src.base = (uint8_t *)0x0;
    (packet->cid).src.len = 0;
    packet->version = 0;
    packet->encrypted_off = (long)puVar12 - (long)pbVar6;
    aVar5 = QUICLY__DECODED_PACKET_CACHED_MAYBE_STATELESS_RESET;
  }
  packet->_is_stateless_reset_cached = aVar5;
  *off = *off + (packet->octets).len;
  return (packet->octets).len;
}

Assistant:

size_t quicly_decode_packet(quicly_context_t *ctx, quicly_decoded_packet_t *packet, const uint8_t *datagram, size_t datagram_size,
                            size_t *off)
{
    const uint8_t *src = datagram, *src_end = datagram + datagram_size;

    assert(*off <= datagram_size);

    packet->octets = ptls_iovec_init(src + *off, datagram_size - *off);
    if (packet->octets.len < 2)
        goto Error;
    packet->datagram_size = *off == 0 ? datagram_size : 0;
    packet->token = ptls_iovec_init(NULL, 0);
    packet->decrypted.pn = UINT64_MAX;

    /* move the cursor to the second byte */
    src += *off + 1;

    if (QUICLY_PACKET_IS_LONG_HEADER(packet->octets.base[0])) {
        /* long header */
        uint64_t rest_length;
        if (src_end - src < 5)
            goto Error;
        packet->version = quicly_decode32(&src);
        packet->cid.dest.encrypted.len = *src++;
        if (src_end - src < packet->cid.dest.encrypted.len + 1)
            goto Error;
        packet->cid.dest.encrypted.base = (uint8_t *)src;
        src += packet->cid.dest.encrypted.len;
        packet->cid.src.len = *src++;
        if (src_end - src < packet->cid.src.len)
            goto Error;
        packet->cid.src.base = (uint8_t *)src;
        src += packet->cid.src.len;
        switch (packet->octets.base[0] & QUICLY_PACKET_TYPE_BITMASK) {
        case QUICLY_PACKET_TYPE_INITIAL:
        case QUICLY_PACKET_TYPE_0RTT:
            if (ctx->cid_encryptor == NULL || packet->cid.dest.encrypted.len == 0 ||
                ctx->cid_encryptor->decrypt_cid(ctx->cid_encryptor, &packet->cid.dest.plaintext, packet->cid.dest.encrypted.base,
                                                packet->cid.dest.encrypted.len) == SIZE_MAX)
                packet->cid.dest.plaintext = quicly_cid_plaintext_invalid;
            packet->cid.dest.might_be_client_generated = 1;
            break;
        default:
            if (ctx->cid_encryptor != NULL) {
                if (packet->cid.dest.encrypted.len == 0)
                    goto Error;
                if (ctx->cid_encryptor->decrypt_cid(ctx->cid_encryptor, &packet->cid.dest.plaintext,
                                                    packet->cid.dest.encrypted.base, packet->cid.dest.encrypted.len) == SIZE_MAX)
                    goto Error;
            } else {
                packet->cid.dest.plaintext = quicly_cid_plaintext_invalid;
            }
            packet->cid.dest.might_be_client_generated = 0;
            break;
        }
        switch (packet->version) {
        case QUICLY_PROTOCOL_VERSION_CURRENT:
        case QUICLY_PROTOCOL_VERSION_DRAFT27:
            /* these are the recognized versions, and they share the same packet header format */
            if ((packet->octets.base[0] & QUICLY_PACKET_TYPE_BITMASK) == QUICLY_PACKET_TYPE_RETRY) {
                /* retry */
                if (src_end - src <= PTLS_AESGCM_TAG_SIZE)
                    goto Error;
                packet->token = ptls_iovec_init(src, src_end - src - PTLS_AESGCM_TAG_SIZE);
                src += packet->token.len;
                packet->encrypted_off = src - packet->octets.base;
            } else {
                /* coalescible long header packet */
                if ((packet->octets.base[0] & QUICLY_PACKET_TYPE_BITMASK) == QUICLY_PACKET_TYPE_INITIAL) {
                    /* initial has a token */
                    uint64_t token_len;
                    if ((token_len = quicly_decodev(&src, src_end)) == UINT64_MAX)
                        goto Error;
                    if (src_end - src < token_len)
                        goto Error;
                    packet->token = ptls_iovec_init(src, token_len);
                    src += token_len;
                }
                if ((rest_length = quicly_decodev(&src, src_end)) == UINT64_MAX)
                    goto Error;
                if (rest_length < 1)
                    goto Error;
                if (src_end - src < rest_length)
                    goto Error;
                packet->encrypted_off = src - packet->octets.base;
                packet->octets.len = packet->encrypted_off + rest_length;
            }
            break;
        default:
            /* VN packet or packets of unknown version cannot be parsed. `encrypted_off` is set to the first byte after SCID. */
            packet->encrypted_off = src - packet->octets.base;
        }
        packet->_is_stateless_reset_cached = QUICLY__DECODED_PACKET_CACHED_NOT_STATELESS_RESET;
    } else {
        /* short header */
        if (ctx->cid_encryptor != NULL) {
            if (src_end - src < QUICLY_MAX_CID_LEN_V1)
                goto Error;
            size_t local_cidl = ctx->cid_encryptor->decrypt_cid(ctx->cid_encryptor, &packet->cid.dest.plaintext, src, 0);
            if (local_cidl == SIZE_MAX)
                goto Error;
            packet->cid.dest.encrypted = ptls_iovec_init(src, local_cidl);
            src += local_cidl;
        } else {
            packet->cid.dest.encrypted = ptls_iovec_init(NULL, 0);
            packet->cid.dest.plaintext = quicly_cid_plaintext_invalid;
        }
        packet->cid.dest.might_be_client_generated = 0;
        packet->cid.src = ptls_iovec_init(NULL, 0);
        packet->version = 0;
        packet->encrypted_off = src - packet->octets.base;
        packet->_is_stateless_reset_cached = QUICLY__DECODED_PACKET_CACHED_MAYBE_STATELESS_RESET;
    }

    *off += packet->octets.len;
    return packet->octets.len;

Error:
    return SIZE_MAX;
}